

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.hh
# Opt level: O2

int4 ActionInferTypes::propagateAddPointer(PcodeOp *op,int4 slot)

{
  OpCode OVar1;
  int4 iVar2;
  Varnode *pVVar3;
  
  OVar1 = op->opcode->opcode;
  if (OVar1 == CPUI_PTRADD && slot == 0) {
    pVVar3 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start[2];
  }
  else {
    if (OVar1 != CPUI_PTRSUB || slot != 0) {
      iVar2 = -1;
      if (OVar1 == CPUI_INT_ADD) {
        pVVar3 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start[1 - slot];
        if ((pVVar3->flags & 2) == 0) {
          if (((pVVar3->flags & 0x10) != 0) && (pVVar3->def->opcode->opcode == CPUI_INT_MULT)) {
            return -(uint)(((pVVar3->temp).dataType)->metatype == TYPE_PTR);
          }
        }
        else if (((pVVar3->temp).dataType)->metatype != TYPE_PTR) {
          iVar2 = (int4)(pVVar3->loc).offset;
        }
      }
      return iVar2;
    }
    pVVar3 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start[1];
  }
  return (int4)(pVVar3->loc).offset;
}

Assistant:

TypeOp *getOpcode(void) const { return opcode; }